

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

void * realloc_array(void *src,size_t old_n,size_t new_n,size_t size)

{
  void *__dest;
  
  __dest = wally_malloc(size * new_n);
  if (__dest == (void *)0x0) {
    __dest = (void *)0x0;
  }
  else {
    if (src != (void *)0x0) {
      memcpy(__dest,src,size * old_n);
    }
    wally_clear((void *)((long)__dest + size * old_n),(new_n - old_n) * size);
  }
  return __dest;
}

Assistant:

void *realloc_array(const void *src, size_t old_n, size_t new_n, size_t size)
{
    unsigned char *p = wally_malloc(new_n * size);
    if (!p)
        return NULL;
    if (src)
        memcpy(p, src, old_n * size);
    wally_clear(p + old_n * size, (new_n - old_n) * size);
    return p;
}